

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O2

RunResult __thiscall
wabt::interp::Thread::DoAtomicRmw<unsigned_int,unsigned_char>
          (Thread *this,BinopFunc<unsigned_char,_unsigned_char> *f,Instr instr,Ptr *out_trap)

{
  Store *store;
  uint uVar1;
  Result RVar2;
  u64 offset;
  RunResult RVar3;
  uchar old;
  BinopFunc<unsigned_char,_unsigned_char> *f_local;
  Ptr memory;
  Ptr local_68;
  string local_50;
  
  f_local = f;
  RefPtr<wabt::interp::Memory>::RefPtr
            (&memory,this->store_,
             (Ref)(this->inst_->memories_).
                  super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                  super__Vector_impl_data._M_start[instr.field_2.imm_u32].index);
  uVar1 = Pop<unsigned_int>(this);
  offset = PopPtr(this,&memory);
  RVar2 = Memory::AtomicRmw<unsigned_char,unsigned_char(*&)(unsigned_char,unsigned_char)>
                    (memory.obj_,offset,(ulong)instr.field_2.imm_u32x2.snd,(uchar)uVar1,&f_local,
                     &old);
  if (RVar2.enum_ == Error) {
    store = this->store_;
    StringPrintf_abi_cxx11_
              (&local_50,"invalid atomic access at %lu+%u",offset,(ulong)instr.field_2.imm_u32x2.snd
              );
    Trap::New(&local_68,store,&local_50,&this->frames_);
    out_trap->obj_ = local_68.obj_;
    out_trap->store_ = local_68.store_;
    out_trap->root_index_ = local_68.root_index_;
    local_68.obj_ = (Trap *)0x0;
    local_68.store_ = (Store *)0x0;
    local_68.root_index_ = 0;
    RefPtr<wabt::interp::Trap>::reset(&local_68);
    std::__cxx11::string::_M_dispose();
    RVar3 = Trap;
  }
  else {
    Push<unsigned_int>(this,(uint)old);
    RVar3 = Ok;
  }
  RefPtr<wabt::interp::Memory>::reset(&memory);
  return RVar3;
}

Assistant:

RunResult Thread::DoAtomicRmw(BinopFunc<T, T> f,
                              Instr instr,
                              Trap::Ptr* out_trap) {
  Memory::Ptr memory{store_, inst_->memories()[instr.imm_u32x2.fst]};
  T val = static_cast<T>(Pop<R>());
  u64 offset = PopPtr(memory);
  T old;
  TRAP_IF(Failed(memory->AtomicRmw(offset, instr.imm_u32x2.snd, val, f, &old)),
          StringPrintf("invalid atomic access at %" PRIaddress "+%u", offset,
                       instr.imm_u32x2.snd));
  Push(static_cast<R>(old));
  return RunResult::Ok;
}